

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O1

void __thiscall TPZIntTriang::SetOrder(TPZIntTriang *this,TPZVec<int> *ord,int type)

{
  uint *puVar1;
  TPZIntRuleT *pTVar2;
  uint uVar3;
  
  puVar1 = (uint *)ord->fStore;
  uVar3 = *puVar1;
  this->fOrdKsi = uVar3;
  if ((int)*puVar1 < (int)puVar1[1]) {
    uVar3 = puVar1[1];
  }
  this->fOrdKsi = uVar3;
  if ((0x15 < *puVar1) || (0x15 < puVar1[1])) {
    this->fOrdKsi = 0x15;
  }
  pTVar2 = TPZIntRuleList::GetRuleT(&TPZIntRuleList::gIntRuleList,this->fOrdKsi);
  this->fIntKsi = pTVar2;
  this->fOrdKsi = pTVar2->fOrder;
  return;
}

Assistant:

void TPZIntTriang::SetOrder(TPZVec<int> &ord,int type) {
#ifdef PZDEBUG
    if (type != 0) {
        DebugStop();
    }
#endif
	fOrdKsi = ord[0];
	if(ord[1] > ord[0]) fOrdKsi = ord[1];
	if(ord[0] < 0 || ord[0] > TPZIntRuleT::NRULESTRIANGLE_ORDER || ord[1] < 0 || ord[1] > TPZIntRuleT::NRULESTRIANGLE_ORDER) 
	{
#ifdef PZDEBUG
#ifdef PZ_LOG
		LOGPZ_WARN(logger,"Integration rule for triangle - Order is bigger than NRULESTRIANGLE_ORDER (Max)");
#endif
#endif
		
		fOrdKsi = TPZIntRuleT::NRULESTRIANGLE_ORDER;//havendo erro assume a maxima ordem
	}
	fIntKsi = TPZIntRuleList::gIntRuleList.GetRuleT(fOrdKsi);
    fOrdKsi = fIntKsi->Order();
}